

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::string_t,duckdb::string_t,duckdb::NotEquals,false,true>
                (string_t *ldata,string_t *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask
                ,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  string_t *psVar5;
  ulong uVar6;
  sel_t sVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar3 = SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::NotEquals,false,true,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar3;
    }
    if (count + 0x3f < 0x40) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar6 = 0;
      uVar8 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar9 = 0xffffffffffffffff;
        }
        else {
          uVar9 = puVar1[uVar6];
        }
        uVar11 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar11 = count;
        }
        uVar10 = uVar11;
        if (uVar9 != 0) {
          uVar10 = uVar8;
          if (uVar9 == 0xffffffffffffffff) {
            if (uVar8 < uVar11) {
              psVar5 = ldata + uVar8;
              do {
                uVar8 = uVar10;
                if (sel->sel_vector != (sel_t *)0x0) {
                  uVar8 = (ulong)sel->sel_vector[uVar10];
                }
                bVar2 = string_t::operator==(psVar5,rdata);
                true_sel->sel_vector[iVar3] = (sel_t)uVar8;
                iVar3 = iVar3 + !bVar2;
                uVar10 = uVar10 + 1;
                psVar5 = psVar5 + 1;
              } while (uVar11 != uVar10);
            }
          }
          else if (uVar8 < uVar11) {
            psVar5 = ldata + uVar8;
            uVar10 = 0;
            do {
              if (sel->sel_vector == (sel_t *)0x0) {
                sVar7 = (int)uVar8 + (int)uVar10;
              }
              else {
                sVar7 = sel->sel_vector[uVar8 + uVar10];
              }
              if ((uVar9 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar4 = 0;
              }
              else {
                bVar2 = string_t::operator==(psVar5,rdata);
                uVar4 = (ulong)!bVar2;
              }
              true_sel->sel_vector[iVar3] = sVar7;
              iVar3 = iVar3 + uVar4;
              uVar10 = uVar10 + 1;
              psVar5 = psVar5 + 1;
            } while ((uVar8 - uVar11) + uVar10 != 0);
            uVar10 = uVar8 + uVar10;
          }
        }
        uVar6 = uVar6 + 1;
        uVar8 = uVar10;
      } while (uVar6 != count + 0x3f >> 6);
    }
  }
  else {
    iVar3 = SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::NotEquals,false,true,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}